

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeamCityTestOutput.cpp
# Opt level: O0

void __thiscall
TeamCityTestOutput::printCurrentGroupStarted(TeamCityTestOutput *this,UtestShell *test)

{
  SimpleString *in_RDI;
  UtestShell *in_stack_ffffffffffffffb8;
  char *s;
  TeamCityTestOutput *in_stack_ffffffffffffffd0;
  char local_20 [32];
  
  s = local_20;
  UtestShell::getGroup(in_stack_ffffffffffffffb8);
  SimpleString::operator=(in_RDI,(SimpleString *)in_stack_ffffffffffffffb8);
  SimpleString::~SimpleString((SimpleString *)0x17869b);
  (**(code **)(in_RDI->buffer_ + 0x58))(in_RDI,"##teamcity[testSuiteStarted name=\'");
  SimpleString::asCharString((SimpleString *)0x1786bb);
  printEscaped(in_stack_ffffffffffffffd0,s);
  (**(code **)(in_RDI->buffer_ + 0x58))(in_RDI,"\']\n");
  return;
}

Assistant:

void TeamCityTestOutput::printCurrentGroupStarted(const UtestShell& test)
{
    currGroup_ = test.getGroup();
    print("##teamcity[testSuiteStarted name='");
    printEscaped(currGroup_.asCharString());
    print("']\n");
}